

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFileCreation.cpp
# Opt level: O2

uint32_t c_symlink2(LinkedObjectFile *f,vector<unsigned_char,_std::allocator<unsigned_char>_> *data,
                   uint32_t code_ptr_offset,uint32_t link_ptr_offset,SymbolLinkKind kind,char *name,
                   int seg_id)

{
  uint32_t *puVar1;
  byte bVar2;
  uint3 uVar3;
  TypeInfo *pTVar4;
  byte *pbVar5;
  const_reference pvVar6;
  uint *puVar7;
  uint uVar8;
  Kind kind_00;
  uint uVar9;
  ulong __n;
  allocator local_69;
  uint32_t local_68;
  SymbolLinkKind local_64;
  char *local_60;
  LinkedObjectFile *local_58;
  string local_50;
  
  local_68 = code_ptr_offset;
  local_64 = kind;
  local_58 = f;
  pTVar4 = get_type_info();
  local_60 = name;
  std::__cxx11::string::string((string *)&local_50,name,&local_69);
  TypeInfo::inform_symbol_with_no_type_info(pTVar4,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  __n = (ulong)local_68;
  do {
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (data,(ulong)link_ptr_offset);
    bVar2 = *pbVar5;
    uVar8 = (uint)bVar2;
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (data,(ulong)link_ptr_offset);
    if ((bVar2 & 3) == 0) {
      link_ptr_offset = link_ptr_offset + 1;
    }
    else {
      uVar8 = (uint)CONCAT11(pvVar6[1],bVar2);
      if ((bVar2 & 2) == 0) {
        link_ptr_offset = link_ptr_offset + 2;
      }
      else {
        uVar3 = CONCAT12(pvVar6[2],CONCAT11(pvVar6[1],bVar2));
        uVar8 = (uint)uVar3;
        if ((bVar2 & 1) == 0) {
          link_ptr_offset = link_ptr_offset + 3;
        }
        else {
          uVar8 = CONCAT13(pvVar6[3],uVar3);
          link_ptr_offset = link_ptr_offset + 4;
        }
      }
    }
    puVar1 = &(local_58->stats).total_v2_symbol_links;
    *puVar1 = *puVar1 + 1;
    uVar9 = (int)__n + (uVar8 & 0xfffffffc);
    __n = (ulong)uVar9;
    puVar7 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(data,__n);
    uVar8 = *puVar7;
    if (uVar8 == 0xffffffff) {
      kind_00 = SYM_PTR;
      if (local_64 != SYMBOL) {
        if (local_64 == TYPE) {
          pTVar4 = get_type_info();
          std::__cxx11::string::string((string *)&local_50,local_60,&local_69);
          TypeInfo::inform_type(pTVar4,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          kind_00 = TYPE_PTR;
        }
        else {
          kind_00 = EMPTY_PTR;
        }
      }
      LinkedObjectFile::symbol_link_word(local_58,seg_id,uVar9 - local_68,local_60,kind_00);
    }
    else {
      if (((short)uVar8 != 0) && ((uVar8 & 0xffff) != 0xffff)) {
        __assert_fail("(code_value & 0xffff) == 0 || (code_value & 0xffff) == 0xffff",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x90,
                      "uint32_t c_symlink2(LinkedObjectFile &, const std::vector<uint8_t> &, uint32_t, uint32_t, SymbolLinkKind, const char *, int)"
                     );
      }
      if (local_64 != SYMBOL) {
        __assert_fail("kind == SymbolLinkKind::SYMBOL",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x91,
                      "uint32_t c_symlink2(LinkedObjectFile &, const std::vector<uint8_t> &, uint32_t, uint32_t, SymbolLinkKind, const char *, int)"
                     );
      }
      LinkedObjectFile::symbol_link_offset(local_58,seg_id,uVar9 - local_68,local_60);
    }
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (data,(ulong)link_ptr_offset);
    if (*pvVar6 == '\0') {
      return link_ptr_offset + 1;
    }
  } while( true );
}

Assistant:

static uint32_t c_symlink2(LinkedObjectFile& f,
                           const std::vector<uint8_t>& data,
                           uint32_t code_ptr_offset,
                           uint32_t link_ptr_offset,
                           SymbolLinkKind kind,
                           const char* name,
                           int seg_id) {
  get_type_info().inform_symbol_with_no_type_info(name);
  auto initial_offset = code_ptr_offset;
  do {
    auto table_value = data.at(link_ptr_offset);
    const uint8_t* relocPtr = &data.at(link_ptr_offset);

    // link table has a series of variable-length-encoded integers indicating the seek amount to hit
    // each reference to the symbol.  It ends when the seek is 0, and all references to this symbol
    // have been patched.
    uint32_t seek = table_value;
    uint32_t next_reloc = link_ptr_offset + 1;

    if (seek & 3) {
      seek = (relocPtr[1] << 8) | table_value;
      next_reloc = link_ptr_offset + 2;
      if (seek & 2) {
        seek = (relocPtr[2] << 16) | seek;
        next_reloc = link_ptr_offset + 3;
        if (seek & 1) {
          seek = (relocPtr[3] << 24) | seek;
          next_reloc = link_ptr_offset + 4;
        }
      }
    }

    f.stats.total_v2_symbol_links++;
    link_ptr_offset = next_reloc;

    code_ptr_offset += (seek & 0xfffffffc);

    // the value of the code gives us more information
    uint32_t code_value = *(const uint32_t*)(&data.at(code_ptr_offset));
    if (code_value == 0xffffffff) {
      // absolute link - replace entire word with a pointer.
      LinkedWord::Kind word_kind;
      switch (kind) {
        case SymbolLinkKind::SYMBOL:
          word_kind = LinkedWord::SYM_PTR;
          break;
        case SymbolLinkKind::EMPTY_LIST:
          word_kind = LinkedWord::EMPTY_PTR;
          break;
        case SymbolLinkKind::TYPE:
          get_type_info().inform_type(name);
          word_kind = LinkedWord::TYPE_PTR;
          break;
        default:
          throw std::runtime_error("unhandled SymbolLinkKind");
      }

      f.symbol_link_word(seg_id, code_ptr_offset - initial_offset, name, word_kind);
    } else {
      // offset link - replace lower 16 bits with symbol table offset.

      assert((code_value & 0xffff) == 0 || (code_value & 0xffff) == 0xffff);
      assert(kind == SymbolLinkKind::SYMBOL);
      //      assert(false); // this case does not occur in V2/V4.  It does in V3.
      f.symbol_link_offset(seg_id, code_ptr_offset - initial_offset, name);
    }

  } while (data.at(link_ptr_offset));

  // seek past terminating 0.
  return link_ptr_offset + 1;
}